

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowBase.cpp
# Opt level: O2

bool __thiscall sf::WindowBase::pollEvent(WindowBase *this,Event *event)

{
  bool bVar1;
  bool bVar2;
  
  if (this->m_impl == (WindowImpl *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = false;
    bVar1 = priv::WindowImpl::popEvent(this->m_impl,event,false);
    if (bVar1) {
      filterEvent(this,event);
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool WindowBase::pollEvent(Event& event)
{
    if (m_impl && m_impl->popEvent(event, false))
    {
        return filterEvent(event);
    }
    else
    {
        return false;
    }
}